

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

thread_record * __thiscall
cds::urcu::details::thread_list<cds::urcu::general_threaded_tag,_std::allocator<int>_>::alloc
          (thread_list<cds::urcu::general_threaded_tag,_std::allocator<int>_> *this)

{
  atomic<unsigned_long> *paVar1;
  value_type *pvVar2;
  thread_data<cds::urcu::general_threaded_tag> *ptVar3;
  thread_data<cds::urcu::general_threaded_tag> *ptVar4;
  thread_record *ptVar5;
  bool bVar6;
  ThreadId curThreadId;
  Allocator<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>,_std::allocator<int>_>
  local_11;
  __atomic_base<unsigned_long> local_10;
  
  local_10._M_i = pthread_self();
  ptVar5 = *(thread_record **)this;
  while( true ) {
    if (ptVar5 == (thread_record *)0x0) {
      pvVar2 = cds::details::
               Allocator<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>,_std::allocator<int>_>
               ::New<unsigned_long>(&local_11,&local_10._M_i);
      ptVar3 = *(thread_data<cds::urcu::general_threaded_tag> **)this;
      do {
        (pvVar2->m_list).next_ = ptVar3;
        LOCK();
        ptVar4 = *(thread_data<cds::urcu::general_threaded_tag> **)this;
        bVar6 = ptVar3 == ptVar4;
        if (bVar6) {
          *(value_type **)this = pvVar2;
          ptVar4 = ptVar3;
        }
        UNLOCK();
        ptVar3 = ptVar4;
      } while (!bVar6);
      return pvVar2;
    }
    paVar1 = &(ptVar5->m_list).thread_id_;
    LOCK();
    bVar6 = (paVar1->super___atomic_base<unsigned_long>)._M_i == 0;
    if (bVar6) {
      (paVar1->super___atomic_base<unsigned_long>)._M_i = local_10._M_i;
    }
    UNLOCK();
    if (bVar6) break;
    ptVar5 = (ptVar5->m_list).next_;
  }
  return ptVar5;
}

Assistant:

thread_record * alloc()
                {
                    thread_record * pRec;
                    cds::OS::ThreadId const nullThreadId = cds::OS::c_NullThreadId;
                    cds::OS::ThreadId const curThreadId  = cds::OS::get_current_thread_id();

                    // First, try to reuse a retired (non-active) HP record
                    for ( pRec = m_pHead.load( atomics::memory_order_acquire ); pRec; pRec = pRec->m_list.next_ ) {
                        cds::OS::ThreadId thId = nullThreadId;
                        if ( !pRec->m_list.thread_id_.compare_exchange_strong( thId, curThreadId, atomics::memory_order_acquire, atomics::memory_order_relaxed ))
                            continue;
                        return pRec;
                    }

                    // No records available for reuse
                    // Allocate and push a new record
                    pRec = allocator_type().New( curThreadId );

                    thread_record * pOldHead = m_pHead.load( atomics::memory_order_acquire );
                    do {
                        // Compiler barriers: assignment MUST BE inside the loop
                        CDS_COMPILER_RW_BARRIER;
                        pRec->m_list.next_ = pOldHead;
                        CDS_COMPILER_RW_BARRIER;
                    } while ( !m_pHead.compare_exchange_weak( pOldHead, pRec, atomics::memory_order_release, atomics::memory_order_acquire ));

                    return pRec;
                }